

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

PointSet * __thiscall
hnsw::HNSWIndex::SelectNeighborsHeuristic(HNSWIndex *this,float *q,PointSet *candidates,uint32_t M)

{
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  _Var1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  float *pfVar5;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *in_RCX;
  long in_RSI;
  PointSet *in_RDI;
  uint in_R8D;
  float dist;
  pair<unsigned_int,_float> *neighbor_1;
  iterator __end3_1;
  iterator __begin3_1;
  PointSet *__range3_1;
  pair<unsigned_int,_float> *neighbor;
  iterator __end3;
  iterator __begin3;
  PointSet *__range3;
  bool is_nearest;
  Point p;
  MinHeap closest_points;
  PointSet *selected_points;
  PointGreaterComparator *in_stack_fffffffffffffed8;
  Matrix *in_stack_fffffffffffffee0;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  PointSet *this_00;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_ffffffffffffff28;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_ffffffffffffff30;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_c8 [2];
  reference local_b8;
  pair<unsigned_int,_float> *local_b0;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_a8 [2];
  byte local_91;
  value_type local_90;
  undefined1 local_85;
  undefined1 local_78 [16];
  undefined8 local_68;
  pair<unsigned_int,_float> *local_58;
  pair<unsigned_int,_float> *local_50;
  uint local_24;
  
  this_00 = in_RDI;
  local_24 = in_R8D;
  sVar3 = std::
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
          size(in_RCX);
  if (local_24 < sVar3) {
    local_50 = (pair<unsigned_int,_float> *)
               std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::begin((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        *)in_stack_fffffffffffffed8);
    local_58 = (pair<unsigned_int,_float> *)
               std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::end((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      *)in_stack_fffffffffffffed8);
    local_78 = (undefined1  [16])0x0;
    local_68 = 0;
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            *)0x118ede);
    _Var1._M_current._4_4_ = in_stack_fffffffffffffef4;
    _Var1._M_current._0_4_ = in_stack_fffffffffffffef0;
    MinHeap::
    priority_queue<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,float>*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>
              ((MinHeap *)in_stack_fffffffffffffee0,_Var1,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffed8,
               (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)0x118f08);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_85 = 0;
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            *)0x118f29);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    reserve(this_00,(size_type)in_RDI);
    do {
      do {
        bVar2 = std::
                priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                ::empty((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                         *)0x118f4d);
        if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0011918f;
        pvVar4 = std::
                 priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                 ::top((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                        *)0x118f6a);
        local_90 = *pvVar4;
        std::
        priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
        ::pop((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
               *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        local_91 = 1;
        local_a8[0]._M_current =
             (pair<unsigned_int,_float> *)
             std::
             vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ::begin((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      *)in_stack_fffffffffffffed8);
        local_b0 = (pair<unsigned_int,_float> *)
                   std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::end((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          *)in_stack_fffffffffffffed8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_stack_fffffffffffffee0,
                                  (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_stack_fffffffffffffed8), bVar2) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                     ::operator*(local_a8);
          Matrix::operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(local_a8);
        }
        local_c8[0]._M_current =
             (pair<unsigned_int,_float> *)
             std::
             vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ::begin((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      *)in_stack_fffffffffffffed8);
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        end((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)in_stack_fffffffffffffed8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_stack_fffffffffffffee0,
                                  (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_stack_fffffffffffffed8), bVar2) {
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator*(local_c8);
          in_stack_fffffffffffffee0 = *(Matrix **)(in_RSI + 0xb8);
          in_stack_fffffffffffffed8 = (PointGreaterComparator *)(in_RSI + 0x80);
          in_stack_fffffffffffffee8._M_current =
               (pair<unsigned_int,_float> *)
               Matrix::operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
          pfVar5 = Matrix::operator[](in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
          in_stack_fffffffffffffef4 =
               (float)(*(code *)*(((MinHeapImpl *)&in_stack_fffffffffffffee0->data_)->c).
                                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)
                                (in_stack_fffffffffffffee0,in_stack_fffffffffffffee8._M_current,
                                 pfVar5);
          if (in_stack_fffffffffffffef4 < local_90.second) {
            local_91 = 0;
            break;
          }
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(local_c8);
        }
      } while ((local_91 & 1) == 0);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::push_back((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  in_stack_fffffffffffffee8._M_current);
      sVar3 = std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::size(in_RDI);
    } while (sVar3 != local_24);
LAB_0011918f:
    local_85 = 1;
    MinHeap::~MinHeap((MinHeap *)0x1191b8);
  }
  else {
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    vector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  return this_00;
}

Assistant:

PointSet SelectNeighborsHeuristic(const float *q, PointSet &candidates, uint32_t M) {
    if (candidates.size() <= M) {
      return candidates;
    }

    MinHeap closest_points(candidates.begin(), candidates.end());

    PointSet selected_points;
    selected_points.reserve(M);
    while (!closest_points.empty()) {
      Point p = closest_points.top();
      closest_points.pop();

      bool is_nearest = true;

#ifdef PREFETCH_DATA
      // prefetch into cache
      for (const auto &neighbor : selected_points) {
        _mm_prefetch(points_[neighbor.first], _MM_HINT_T0);
      }
#endif

      for (const auto &neighbor : selected_points) {
        float dist = distance_(points_[p.first], points_[neighbor.first]);
        if (dist < p.second) {
          is_nearest = false;
          break;
        }
      }
      if (is_nearest) {
        selected_points.push_back(p);
        if (selected_points.size() == M) {
          break;
        }
      }
    }

    return selected_points;
  }